

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  bool bVar1;
  Expr *p;
  int iVar2;
  Expr *extraout_RDX;
  Expr *extraout_RDX_00;
  Expr *extraout_RDX_01;
  Expr *extraout_RDX_02;
  int iVar3;
  long lVar4;
  ExprList_item *pEVar5;
  u16 uVar6;
  ExprList *pOrderBy_00;
  long lVar7;
  int iCol;
  int local_6c;
  Select *local_68;
  uint local_5c;
  Parse *local_58;
  ExprList *local_50;
  char *local_48;
  NameContext *local_40;
  ExprList_item *local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_58 = pNC->pParse;
  pOrderBy_00 = pOrderBy;
  local_68 = pSelect;
  local_40 = pNC;
  if (0 < pOrderBy->nExpr) {
    local_5c = pSelect->pEList->nExpr;
    pEVar5 = pOrderBy->a;
    iVar3 = 0;
    do {
      pExpr = pEVar5->pExpr;
      local_6c = resolveAsName((Parse *)local_68->pEList,(ExprList *)pExpr,(Expr *)pOrderBy);
      p = pExpr;
      if (local_6c < 1) {
        for (; (p != (Expr *)0x0 && ((p->op == '\\' || (p->op == '\x18')))); p = p->pLeft) {
        }
        iVar2 = sqlite3ExprIsInteger(p,&local_6c);
        if (iVar2 == 0) {
          pEVar5->iOrderByCol = 0;
          iVar2 = sqlite3ResolveExprNames(local_40,pExpr);
          bVar1 = true;
          pOrderBy = (ExprList *)extraout_RDX_01;
          if (iVar2 == 0) {
            lVar4 = (long)local_68->pEList->nExpr;
            bVar1 = false;
            if (0 < lVar4) {
              local_38 = local_68->pEList->a;
              uVar6 = 1;
              lVar7 = 0;
              local_50 = pOrderBy_00;
              local_48 = zType;
              do {
                iVar2 = sqlite3ExprCompare(pExpr,*(Expr **)((long)&local_38->pExpr + lVar7));
                if (iVar2 == 0) {
                  pEVar5->iOrderByCol = uVar6;
                }
                uVar6 = uVar6 + 1;
                lVar7 = lVar7 + 0x20;
              } while (lVar4 * 0x20 != lVar7);
              bVar1 = false;
              pOrderBy = (ExprList *)extraout_RDX_02;
              zType = local_48;
              pOrderBy_00 = local_50;
            }
          }
        }
        else {
          pOrderBy = (ExprList *)0xffff0000;
          if (0xffff0000 < local_6c - 0x10000U) {
            pEVar5->iOrderByCol = (u16)local_6c;
            goto LAB_0015adc8;
          }
          sqlite3ErrorMsg(local_58,"%r %s BY term out of range - should be between 1 and %d",
                          (ulong)(iVar3 + 1),zType,(ulong)local_5c);
          bVar1 = true;
          pOrderBy = (ExprList *)extraout_RDX_00;
        }
      }
      else {
        pEVar5->iOrderByCol = (u16)local_6c;
        pOrderBy = (ExprList *)extraout_RDX;
LAB_0015adc8:
        bVar1 = false;
      }
      if (bVar1) {
        return 1;
      }
      iVar3 = iVar3 + 1;
      pEVar5 = pEVar5 + 1;
    } while (iVar3 < pOrderBy_00->nExpr);
  }
  iVar3 = sqlite3ResolveOrderGroupBy(local_58,local_68,pOrderBy_00,zType);
  return iVar3;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    iCol = resolveAsName(pParse, pSelect->pEList, pE);
    if( iCol>0 ){
      /* If an AS-name match is found, mark this ORDER BY column as being
      ** a copy of the iCol-th result-set column.  The subsequent call to
      ** sqlite3ResolveOrderGroupBy() will convert the expression to a
      ** copy of the iCol-th result-set expression. */
      pItem->iOrderByCol = (u16)iCol;
      continue;
    }
    if( sqlite3ExprIsInteger(sqlite3ExprSkipCollate(pE), &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(pE, pSelect->pEList->a[j].pExpr)==0 ){
        pItem->iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}